

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyDiscretePure.h
# Opt level: O0

Interface_ProblemToPolicyDiscretePure * __thiscall
JointPolicyDiscretePure::GetInterfacePTPDiscretePure(JointPolicyDiscretePure *this)

{
  Interface_ProblemToPolicyDiscrete *pIVar1;
  Interface_ProblemToPolicyDiscretePure *pIVar2;
  Interface_ProblemToPolicyDiscretePure *pp;
  Interface_ProblemToPolicyDiscrete *p;
  JointPolicyDiscrete *in_stack_ffffffffffffffd8;
  
  pIVar1 = JointPolicyDiscrete::GetInterfacePTPDiscrete(in_stack_ffffffffffffffd8);
  if (pIVar1 == (Interface_ProblemToPolicyDiscrete *)0x0) {
    pIVar2 = (Interface_ProblemToPolicyDiscretePure *)0x0;
  }
  else {
    pIVar2 = (Interface_ProblemToPolicyDiscretePure *)
             __dynamic_cast(pIVar1,&Interface_ProblemToPolicyDiscrete::typeinfo,
                            &Interface_ProblemToPolicyDiscretePure::typeinfo,0);
  }
  return pIVar2;
}

Assistant:

const Interface_ProblemToPolicyDiscretePure* 
            GetInterfacePTPDiscretePure() const
        {
            const Interface_ProblemToPolicyDiscrete* p =
                GetInterfacePTPDiscrete();
            const Interface_ProblemToPolicyDiscretePure* pp = 
                dynamic_cast<const Interface_ProblemToPolicyDiscretePure*>(p);
            return pp;
        }